

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Capabilities __thiscall
QICOPlugin::capabilities(QICOPlugin *this,QIODevice *device,QByteArray *format)

{
  bool bVar1;
  ulong uVar2;
  char **in_RDX;
  QByteArray *in_RSI;
  long in_FS_OFFSET;
  Capabilities cap;
  enum_type in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  enum_type f1;
  QFlagsStorage<QImageIOPlugin::Capability> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = operator==(in_RSI,in_RDX);
  f1 = CONCAT13(1,(int3)in_stack_ffffffffffffffc4);
  if (!bVar1) {
    bVar1 = operator==(in_RSI,in_RDX);
    f1 = CONCAT13(bVar1,(int3)f1);
  }
  if ((char)(f1 >> 0x18) == '\0') {
    bVar1 = QByteArray::isEmpty((QByteArray *)0x103a98);
    if (bVar1) {
      uVar2 = QIODevice::isOpen();
      if ((uVar2 & 1) == 0) {
        memset(&local_c,0,4);
        QFlags<QImageIOPlugin::Capability>::QFlags((QFlags<QImageIOPlugin::Capability> *)0x103ae5);
      }
      else {
        local_c.i = 0xaaaaaaaa;
        QFlags<QImageIOPlugin::Capability>::QFlags((QFlags<QImageIOPlugin::Capability> *)0x103afb);
        uVar2 = QIODevice::isReadable();
        if (((uVar2 & 1) != 0) && (bVar1 = QtIcoHandler::canRead((QIODevice *)0x103b15), bVar1)) {
          QFlags<QImageIOPlugin::Capability>::operator|=
                    ((QFlags<QImageIOPlugin::Capability> *)&local_c,CanRead);
        }
        uVar2 = QIODevice::isWritable();
        if ((uVar2 & 1) != 0) {
          QFlags<QImageIOPlugin::Capability>::operator|=
                    ((QFlags<QImageIOPlugin::Capability> *)&local_c,CanWrite);
        }
      }
    }
    else {
      memset(&local_c,0,4);
      QFlags<QImageIOPlugin::Capability>::QFlags((QFlags<QImageIOPlugin::Capability> *)0x103ab7);
    }
  }
  else {
    local_c.i = (Int)operator|(f1,in_stack_ffffffffffffffc0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QFlagsStorageHelper<QImageIOPlugin::Capability,_4>)
         (QFlagsStorageHelper<QImageIOPlugin::Capability,_4>)local_c.i;
}

Assistant:

QImageIOPlugin::Capabilities QICOPlugin::capabilities(QIODevice *device, const QByteArray &format) const
{
    if (format == "ico" || format == "cur")
        return Capabilities(CanRead | CanWrite);
    if (!format.isEmpty())
        return { };
    if (!device->isOpen())
        return { };

    Capabilities cap;
    if (device->isReadable() && QtIcoHandler::canRead(device))
        cap |= CanRead;
    if (device->isWritable())
        cap |= CanWrite;
    return cap;
}